

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 uVar4;
  mz_zip_internal_state *pmVar5;
  undefined4 *puVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  mz_uint32 t;
  byte bVar18;
  ushort uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  
  pmVar5 = pZip->m_pState;
  puVar6 = (undefined4 *)(pmVar5->m_sorted_central_dir_offsets).m_p;
  uVar24 = pZip->m_total_files;
  iVar12 = (int)(uVar24 - 2) >> 1;
  if (-1 < iVar12) {
    do {
      iVar21 = iVar12 * 2 + 1;
      if (iVar21 < (int)uVar24) {
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        iVar22 = iVar12;
        do {
          iVar13 = iVar22 * 2 + 2;
          uVar23 = 0;
          if (iVar13 < (int)uVar24) {
            pvVar9 = (pmVar5->m_central_dir).m_p;
            pvVar10 = (pmVar5->m_central_dir_offsets).m_p;
            uVar20 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar21] * 4);
            uVar14 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar13] * 4);
            pbVar25 = (byte *)((long)pvVar9 + uVar20 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar20 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar14 + 0x1c);
            uVar19 = uVar3;
            if (uVar2 < uVar3) {
              uVar19 = uVar2;
            }
            pbVar26 = (byte *)((long)pvVar9 + uVar19 + uVar20 + 0x2e);
            if (uVar19 == 0) {
              bVar18 = 0;
              bVar11 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar14 + 0x2e);
              do {
                bVar11 = *pbVar25;
                bVar18 = bVar11 + 0x20;
                if (0x19 < (byte)(bVar11 + 0xbf)) {
                  bVar18 = bVar11;
                }
                bVar1 = *pbVar27;
                bVar11 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar11 = bVar1;
                }
                if (bVar18 != bVar11) break;
                pbVar25 = pbVar25 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar25 < pbVar26);
            }
            bVar17 = bVar18 < bVar11;
            if (pbVar25 == pbVar26) {
              bVar17 = uVar2 < uVar3;
            }
            uVar23 = (uint)bVar17;
          }
          iVar13 = uVar23 + iVar21;
          uVar23 = puVar6[iVar22];
          uVar14 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar23 * 4);
          uVar20 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar13] * 4);
          pbVar25 = (byte *)((long)pvVar7 + uVar14 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar14 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar20 + 0x1c);
          uVar19 = uVar3;
          if (uVar2 < uVar3) {
            uVar19 = uVar2;
          }
          pbVar26 = (byte *)((long)pvVar7 + uVar19 + uVar14 + 0x2e);
          if (uVar19 == 0) {
            bVar18 = 0;
            bVar11 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar7 + uVar20 + 0x2e);
            do {
              bVar11 = *pbVar25;
              bVar18 = bVar11 + 0x20;
              if (0x19 < (byte)(bVar11 + 0xbf)) {
                bVar18 = bVar11;
              }
              bVar1 = *pbVar27;
              bVar11 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar11 = bVar1;
              }
              if (bVar18 != bVar11) break;
              pbVar25 = pbVar25 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar25 < pbVar26);
          }
          bVar17 = bVar11 <= bVar18;
          if (pbVar25 == pbVar26) {
            bVar17 = uVar3 <= uVar2;
          }
          if (bVar17) break;
          puVar6[iVar22] = puVar6[iVar13];
          puVar6[iVar13] = uVar23;
          iVar21 = iVar13 * 2 + 1;
          iVar22 = iVar13;
        } while (iVar21 < (int)uVar24);
      }
      bVar17 = 0 < iVar12;
      iVar12 = iVar12 + -1;
    } while (bVar17);
  }
  uVar14 = (ulong)uVar24;
  if (1 < (int)uVar24) {
    do {
      uVar20 = uVar14 - 1;
      uVar4 = puVar6[uVar14 - 1];
      puVar6[uVar14 - 1] = *puVar6;
      *puVar6 = uVar4;
      if (2 < (long)uVar14) {
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        iVar12 = 0;
        iVar22 = 1;
        iVar21 = 0;
        do {
          uVar24 = 0;
          if ((long)(iVar12 + 2) < (long)uVar20) {
            pvVar9 = (pmVar5->m_central_dir).m_p;
            pvVar10 = (pmVar5->m_central_dir_offsets).m_p;
            uVar16 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar22] * 4);
            uVar15 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar12 + 2] * 4);
            pbVar25 = (byte *)((long)pvVar9 + uVar16 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar16 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar15 + 0x1c);
            uVar19 = uVar3;
            if (uVar2 < uVar3) {
              uVar19 = uVar2;
            }
            pbVar26 = (byte *)((long)pvVar9 + uVar19 + uVar16 + 0x2e);
            if (uVar19 == 0) {
              bVar18 = 0;
              bVar11 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar15 + 0x2e);
              do {
                bVar11 = *pbVar25;
                bVar18 = bVar11 + 0x20;
                if (0x19 < (byte)(bVar11 + 0xbf)) {
                  bVar18 = bVar11;
                }
                bVar1 = *pbVar27;
                bVar11 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar11 = bVar1;
                }
                if (bVar18 != bVar11) break;
                pbVar25 = pbVar25 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar25 < pbVar26);
            }
            bVar17 = bVar18 < bVar11;
            if (pbVar25 == pbVar26) {
              bVar17 = uVar2 < uVar3;
            }
            uVar24 = (uint)bVar17;
          }
          iVar13 = uVar24 + iVar22;
          uVar24 = puVar6[iVar21];
          uVar15 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar24 * 4);
          uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar13] * 4);
          pbVar25 = (byte *)((long)pvVar7 + uVar15 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar15 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
          uVar19 = uVar3;
          if (uVar2 < uVar3) {
            uVar19 = uVar2;
          }
          pbVar26 = (byte *)((long)pvVar7 + uVar19 + uVar15 + 0x2e);
          if (uVar19 == 0) {
            bVar18 = 0;
            bVar11 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar7 + uVar16 + 0x2e);
            do {
              bVar11 = *pbVar25;
              bVar18 = bVar11 + 0x20;
              if (0x19 < (byte)(bVar11 + 0xbf)) {
                bVar18 = bVar11;
              }
              bVar1 = *pbVar27;
              bVar11 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar11 = bVar1;
              }
              if (bVar18 != bVar11) break;
              pbVar25 = pbVar25 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar25 < pbVar26);
          }
          bVar17 = bVar11 <= bVar18;
          if (pbVar25 == pbVar26) {
            bVar17 = uVar3 <= uVar2;
          }
          if (bVar17) break;
          puVar6[iVar21] = puVar6[iVar13];
          puVar6[iVar13] = uVar24;
          iVar12 = iVar13 * 2;
          iVar22 = iVar13 * 2 + 1;
          iVar21 = iVar13;
        } while ((long)iVar22 < (long)uVar20);
      }
      bVar17 = 2 < (long)uVar14;
      uVar14 = uVar20;
    } while (bVar17);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0)
  {
    int child, root = start;
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= size)
        break;
      child += (((child + 1) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0)
  {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= end)
        break;
      child += (((child + 1) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    end--;
  }
}